

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VEnableConstVectorArray_Serial(N_Vector v,int tf)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = -1;
  if ((v != (N_Vector)0x0) && (v->ops != (_generic_N_Vector_Ops *)0x0)) {
    iVar1 = 0;
    if (tf == 0) {
      pcVar2 = (_func_int_int_realtype_N_Vector_ptr *)0x0;
    }
    else {
      pcVar2 = N_VConstVectorArray_Serial;
    }
    v->ops->nvconstvectorarray = pcVar2;
  }
  return iVar1;
}

Assistant:

int N_VEnableConstVectorArray_Serial(N_Vector v, booleantype tf)
{
  /* check that vector is non-NULL */
  if (v == NULL) return(-1);

  /* check that ops structure is non-NULL */
  if (v->ops == NULL) return(-1);

  /* enable/disable operation */
  if (tf)
    v->ops->nvconstvectorarray = N_VConstVectorArray_Serial;
  else
    v->ops->nvconstvectorarray = NULL;

  /* return success */
  return(0);
}